

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

absl * __thiscall
absl::StrCat_abi_cxx11_(absl *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  reference pcVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  char *pcVar6;
  long lVar7;
  char *out;
  reference local_50;
  char *begin;
  undefined1 local_31;
  AlphaNum *local_30;
  AlphaNum *d_local;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  string *result;
  
  local_31 = 0;
  local_30 = d;
  d_local = c;
  c_local = b;
  b_local = a;
  a_local = (AlphaNum *)this;
  std::__cxx11::string::string((string *)this);
  sVar2 = AlphaNum::size(b_local);
  sVar3 = AlphaNum::size(c_local);
  sVar4 = AlphaNum::size(d_local);
  sVar5 = AlphaNum::size(local_30);
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             sVar2 + sVar3 + sVar4 + sVar5);
  out = (char *)std::__cxx11::string::begin();
  local_50 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&out);
  pcVar6 = Append(local_50,b_local);
  pcVar6 = Append(pcVar6,c_local);
  pcVar6 = Append(pcVar6,d_local);
  pcVar6 = Append(pcVar6,local_30);
  pcVar1 = local_50;
  lVar7 = std::__cxx11::string::size();
  if (pcVar6 != pcVar1 + lVar7) {
    __assert_fail("out == begin + result.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0x84,
                  "string absl::StrCat(const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  return this;
}

Assistant:

string StrCat(const AlphaNum& a, const AlphaNum& b, const AlphaNum& c,
              const AlphaNum& d) {
  string result;
  strings_internal::STLStringResizeUninitialized(
      &result, a.size() + b.size() + c.size() + d.size());
  char* const begin = &*result.begin();
  char* out = begin;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  out = Append(out, d);
  assert(out == begin + result.size());
  return result;
}